

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

void linenoiseRefreshLine(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char *pcVar3;
  uint uVar4;
  size_t sVar5;
  void *__dest;
  void *pvVar6;
  size_t sVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  size_t sVar12;
  int iVar13;
  undefined8 local_98;
  undefined2 local_90;
  ulong local_58;
  ulong local_50;
  char *local_48;
  char *local_40;
  ulong local_38;
  
  if (mlmode == 0) {
    local_40 = ls.prompt;
    sVar5 = strlen(ls.prompt);
    uVar9 = CONCAT44(ls.cols._4_4_,(int)ls.cols);
    uVar10 = CONCAT44(ls.pos._4_4_,(int)ls.pos) + sVar5;
    if (uVar10 < uVar9) {
      local_48 = ls.buf;
      sVar12 = ls.len;
      local_50 = uVar10;
    }
    else {
      local_50 = uVar9 - 1;
      if (uVar10 - 1 < uVar9 - 1) {
        local_50 = uVar10 - 1;
      }
      local_48 = ls.buf + (uVar10 - local_50);
      sVar12 = (ls.len - uVar10) + local_50;
    }
    local_58 = CONCAT44(local_58._4_4_,ls.ofd);
    uVar10 = sVar12 + sVar5;
    if (uVar9 < sVar12 + sVar5) {
      uVar10 = uVar9;
    }
    local_98 = CONCAT62(local_98._2_6_,0xd);
    sVar7 = strlen((char *)&local_98);
    iVar8 = (int)sVar7;
    __dest = malloc((long)iVar8);
    if (__dest == (void *)0x0) {
      iVar8 = 0;
      __dest = (void *)0x0;
    }
    else {
      memcpy(__dest,&local_98,(long)iVar8);
    }
    iVar11 = (int)sVar5;
    iVar13 = (int)uVar10 - iVar11;
    local_38 = (ulong)(uint)(iVar11 + iVar8);
    pvVar6 = realloc(__dest,(long)(iVar11 + iVar8));
    if (pvVar6 != (void *)0x0) {
      memcpy((void *)((long)iVar8 + (long)pvVar6),local_40,(long)iVar11);
      iVar8 = (int)local_38;
      __dest = pvVar6;
    }
    iVar11 = iVar13 + iVar8;
    pvVar6 = realloc(__dest,(long)iVar11);
    if (pvVar6 != (void *)0x0) {
      memcpy((void *)((long)iVar8 + (long)pvVar6),local_48,(long)iVar13);
      __dest = pvVar6;
      iVar8 = iVar11;
    }
    local_98._4_4_ = (uint)((ulong)local_98 >> 0x20) & 0xffffff00;
    local_98 = CONCAT44(local_98._4_4_,0x4b305b1b);
    sVar5 = strlen((char *)&local_98);
    iVar13 = (int)sVar5 + iVar8;
    pvVar6 = realloc(__dest,(long)iVar13);
    if (pvVar6 != (void *)0x0) {
      memcpy((void *)((long)iVar8 + (long)pvVar6),&local_98,(long)(int)sVar5);
      __dest = pvVar6;
      iVar8 = iVar13;
    }
    snprintf((char *)&local_98,0x40,"\r\x1b[%dC",local_50);
    sVar5 = strlen((char *)&local_98);
    iVar13 = (int)sVar5 + iVar8;
    pvVar6 = realloc(__dest,(long)iVar13);
    if (pvVar6 != (void *)0x0) {
      memcpy((void *)((long)iVar8 + (long)pvVar6),&local_98,(long)(int)sVar5);
      __dest = pvVar6;
      iVar8 = iVar13;
    }
    iVar13 = (int)local_58;
    goto LAB_0010b2e4;
  }
  local_48 = (char *)strlen(ls.prompt);
  local_40 = (char *)(long)(int)local_48;
  uVar9 = CONCAT44(ls.cols._4_4_,(int)ls.cols);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar9;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_40 + ls.len + uVar9 + -1;
  local_38 = SUB168(auVar2 / auVar1,0);
  iVar13 = (int)ls.maxrows;
  iVar8 = SUB164(auVar2 / auVar1,0);
  if ((int)ls.maxrows < iVar8) {
    ls.maxrows = (size_t)iVar8;
  }
  local_50 = CONCAT44(local_50._4_4_,ls.ofd);
  if ((int)((ulong)(local_40 + ls.oldpos + uVar9) / uVar9) < iVar13) {
    snprintf((char *)&local_98,0x40,"\x1b[%dB");
    sVar5 = strlen((char *)&local_98);
    __dest = malloc((long)(int)sVar5);
    if (__dest == (void *)0x0) goto LAB_0010ae6e;
    memcpy(__dest,&local_98,(long)(int)sVar5);
    uVar9 = sVar5 & 0xffffffff;
  }
  else {
LAB_0010ae6e:
    uVar9 = 0;
    __dest = (void *)0x0;
  }
  iVar8 = (int)uVar9;
  if (1 < iVar13) {
    iVar13 = iVar13 + -1;
    do {
      local_98 = 0x315b1b4b305b1b0d;
      local_90 = 0x41;
      sVar5 = strlen((char *)&local_98);
      uVar4 = (int)sVar5 + (int)uVar9;
      local_58 = (ulong)uVar4;
      pvVar6 = realloc(__dest,(long)(int)uVar4);
      if (pvVar6 != (void *)0x0) {
        memcpy((void *)((long)(int)uVar9 + (long)pvVar6),&local_98,(long)(int)sVar5);
        __dest = pvVar6;
        uVar9 = local_58;
      }
      iVar8 = (int)uVar9;
      uVar9 = uVar9 & 0xffffffff;
      iVar13 = iVar13 + -1;
    } while (iVar13 != 0);
  }
  local_98 = CONCAT26(local_98._6_2_,0x4b00000000);
  local_98 = CONCAT44(local_98._4_4_,0x305b1b0d);
  sVar5 = strlen((char *)&local_98);
  iVar13 = (int)sVar5 + iVar8;
  pvVar6 = realloc(__dest,(long)iVar13);
  if (pvVar6 != (void *)0x0) {
    memcpy((void *)((long)iVar8 + (long)pvVar6),&local_98,(long)(int)sVar5);
    __dest = pvVar6;
    iVar8 = iVar13;
  }
  pcVar3 = ls.prompt;
  sVar5 = strlen(ls.prompt);
  iVar13 = (int)sVar5 + iVar8;
  pvVar6 = realloc(__dest,(long)iVar13);
  if (pvVar6 != (void *)0x0) {
    memcpy((void *)((long)iVar8 + (long)pvVar6),pcVar3,(long)(int)sVar5);
    __dest = pvVar6;
    iVar8 = iVar13;
  }
  pcVar3 = ls.buf;
  iVar13 = (int)ls.len;
  iVar11 = iVar13 + iVar8;
  pvVar6 = realloc(__dest,(long)iVar11);
  if (pvVar6 != (void *)0x0) {
    memcpy((void *)((long)iVar8 + (long)pvVar6),pcVar3,(long)iVar13);
    __dest = pvVar6;
    iVar8 = iVar11;
  }
  pcVar3 = local_40;
  sVar12 = CONCAT44(ls.pos._4_4_,(int)ls.pos);
  if (((sVar12 == 0) || (sVar12 != ls.len)) ||
     ((ulong)(local_40 + sVar12) % CONCAT44(ls.cols._4_4_,(int)ls.cols) != 0)) {
    iVar13 = (int)local_38;
  }
  else {
    pvVar6 = realloc(__dest,(long)(iVar8 + 1));
    if (pvVar6 != (void *)0x0) {
      *(undefined1 *)((long)pvVar6 + (long)iVar8) = 10;
      __dest = pvVar6;
      iVar8 = iVar8 + 1;
    }
    local_98 = CONCAT62(local_98._2_6_,0xd);
    sVar5 = strlen((char *)&local_98);
    iVar13 = (int)sVar5 + iVar8;
    pvVar6 = realloc(__dest,(long)iVar13);
    if (pvVar6 != (void *)0x0) {
      memcpy((void *)((long)iVar8 + (long)pvVar6),&local_98,(long)(int)sVar5);
      __dest = pvVar6;
      iVar8 = iVar13;
    }
    iVar13 = (int)local_38 + 1;
    if ((int)ls.maxrows <= (int)local_38) {
      ls.maxrows = (size_t)iVar13;
    }
  }
  if ((int)((ulong)(pcVar3 + CONCAT44(ls.cols._4_4_,(int)ls.cols) +
                             CONCAT44(ls.pos._4_4_,(int)ls.pos)) /
           CONCAT44(ls.cols._4_4_,(int)ls.cols)) < iVar13) {
    snprintf((char *)&local_98,0x40,"\x1b[%dA");
    sVar5 = strlen((char *)&local_98);
    iVar13 = (int)sVar5 + iVar8;
    pvVar6 = realloc(__dest,(long)iVar13);
    if (pvVar6 != (void *)0x0) {
      memcpy((void *)((long)iVar8 + (long)pvVar6),&local_98,(long)(int)sVar5);
      __dest = pvVar6;
      iVar8 = iVar13;
    }
  }
  uVar9 = (long)((int)local_48 + (int)ls.pos) % (long)(int)ls.cols;
  if ((int)uVar9 == 0) {
    local_98 = CONCAT62(local_98._2_6_,0xd);
  }
  else {
    snprintf((char *)&local_98,0x40,"\r\x1b[%dC",uVar9 & 0xffffffff);
  }
  sVar5 = strlen((char *)&local_98);
  iVar13 = iVar8 + (int)sVar5;
  pvVar6 = realloc(__dest,(long)iVar13);
  if (pvVar6 != (void *)0x0) {
    memcpy((void *)((long)iVar8 + (long)pvVar6),&local_98,(long)(int)sVar5);
    __dest = pvVar6;
    iVar8 = iVar13;
  }
  ls.oldpos = CONCAT44(ls.pos._4_4_,(int)ls.pos);
  iVar13 = (int)local_50;
LAB_0010b2e4:
  write(iVar13,__dest,(long)iVar8);
  free(__dest);
  return;
}

Assistant:

void linenoiseRefreshLine(void) {
    if (mlmode)
        refreshMultiLine(&ls);
    else
        refreshSingleLine(&ls);
}